

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O1

void set_report(parse_t *ps,char *dest)

{
  pmtr_t *ppVar1;
  UT_array *pUVar2;
  ctor_f *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  char *pcVar8;
  int *piVar9;
  uint uVar10;
  UT_string *pUVar11;
  bool bVar12;
  int fd;
  in_addr_t dest_ip;
  int port;
  char *iface;
  in_addr iface_addr;
  ifreq ifr;
  sockaddr_in sin;
  int local_84;
  in_addr_t local_80;
  ushort local_7c [2];
  char *local_78;
  in_addr local_6c;
  undefined1 local_68 [16];
  ushort local_58;
  in_addr_t local_54;
  sockaddr local_40;
  
  iVar5 = parse_spec(ps->cfg,ps->em,dest,&local_80,(int *)local_7c,&local_78);
  if (iVar5 == 0) {
    if (ps->cfg->test_only != 0) {
      return;
    }
    local_84 = socket(2,2,0);
    bVar12 = true;
    if (local_84 == -1) {
      bVar4 = true;
      goto LAB_00106fc5;
    }
    bVar4 = false;
    uVar6 = fcntl(local_84,1);
    iVar5 = fcntl(local_84,2,(ulong)(uVar6 | 1));
    if (iVar5 == -1) goto LAB_00106fc5;
    gethostname(ps->cfg->report_id,100);
    pcVar8 = local_78;
    if (local_78 != (char *)0x0) {
      sVar7 = strlen(local_78);
      if ((int)sVar7 < 0x10) {
        local_58 = 2;
        memcpy(local_68,pcVar8,(long)((int)sVar7 + 1));
        iVar5 = ioctl(local_84,0x8913,local_68);
        if (iVar5 != 0) {
          pUVar11 = ps->em;
          piVar9 = __errno_location();
          local_78 = strerror(*piVar9);
          pcVar8 = "ioctl: %s\n";
LAB_001071bd:
          utstring_printf(pUVar11,pcVar8,local_78);
          goto LAB_001071c4;
        }
        if ((local_58 & 0x1000) == 0) {
          pUVar11 = ps->em;
          pcVar8 = "%s does not multicast\n";
          goto LAB_001071bd;
        }
        bVar4 = false;
        iVar5 = ioctl(local_84,0x8915,local_68);
        if (iVar5 != 0) {
          pcVar8 = "ioctl: %s\n";
LAB_001071a4:
          pUVar11 = ps->em;
          piVar9 = __errno_location();
          local_78 = strerror(*piVar9);
          goto LAB_001071bd;
        }
        local_6c.s_addr = local_54;
        ppVar1 = ps->cfg;
        sVar7 = strlen(ppVar1->report_id);
        pcVar8 = ppVar1->report_id + sVar7;
        pcVar8[0] = ' ';
        pcVar8[1] = '\0';
        ppVar1 = ps->cfg;
        pcVar8 = inet_ntoa(local_6c);
        strcat(ppVar1->report_id,pcVar8);
        iVar5 = setsockopt(local_84,0,0x20,&local_6c,4);
        if (iVar5 != 0) {
          pcVar8 = "setsockopt: %s\n";
          goto LAB_001071a4;
        }
      }
      else {
        utstring_printf(ps->em,"interface too long\n");
LAB_001071c4:
        bVar4 = true;
      }
      if (bVar4) goto LAB_00106fc2;
      if (bVar4) {
        return;
      }
    }
    local_40.sa_family = 2;
    local_40.sa_data[2] = (undefined1)local_80;
    local_40.sa_data[3] = local_80._1_1_;
    local_40.sa_data[4] = local_80._2_1_;
    local_40.sa_data[5] = local_80._3_1_;
    local_40.sa_data._0_2_ = local_7c[0] << 8 | local_7c[0] >> 8;
    iVar5 = connect(local_84,&local_40,0x10);
    if (iVar5 == -1) {
      pUVar11 = ps->em;
      piVar9 = __errno_location();
      pcVar8 = strerror(*piVar9);
      bVar4 = false;
      utstring_printf(pUVar11,"can\'t connect to %s: %s",dest,pcVar8);
    }
    else {
      pUVar2 = ps->cfg->report;
      uVar6 = pUVar2->i + 1;
      if (pUVar2->n < uVar6) {
        uVar10 = pUVar2->n;
        if (uVar10 < uVar6) {
          do {
            bVar12 = uVar10 == 0;
            uVar10 = uVar10 * 2;
            if (bVar12) {
              uVar10 = 8;
            }
          } while (uVar10 < uVar6);
          pUVar2->n = uVar10;
        }
        pcVar8 = (char *)realloc(pUVar2->d,(ulong)uVar10 * (pUVar2->icd).sz);
        ps->cfg->report->d = pcVar8;
        if (pcVar8 == (char *)0x0) {
          exit(-1);
        }
      }
      pUVar2 = ps->cfg->report;
      pcVar3 = (pUVar2->icd).copy;
      sVar7 = (pUVar2->icd).sz;
      uVar6 = pUVar2->i;
      pUVar2->i = uVar6 + 1;
      if (pcVar3 == (ctor_f *)0x0) {
        memcpy(pUVar2->d + uVar6 * sVar7,&local_84,sVar7);
      }
      else {
        (*pcVar3)(pUVar2->d + uVar6 * sVar7,&local_84);
      }
      bVar4 = false;
      bVar12 = false;
    }
  }
  else {
LAB_00106fc2:
    bVar12 = true;
    bVar4 = false;
  }
LAB_00106fc5:
  if (bVar4) {
    utstring_printf(ps->em,"can\'t open file descriptor");
  }
  if (bVar12) {
    utstring_printf(ps->em," at line %d",(ulong)(uint)ps->line);
    ps->rc = -1;
  }
  return;
}

Assistant:

void set_report(parse_t *ps, char *dest) { 
  int rc = -1, port, flags;
  in_addr_t dest_ip;
  char *iface;

  if (parse_spec(ps->cfg, ps->em, dest, &dest_ip, &port, &iface)) goto done;
  if (ps->cfg->test_only) return;  /* syntax looked ok */

  int fd = socket(AF_INET, SOCK_DGRAM, 0);
  if (fd == -1) {rc = -2; goto done;}

  /* set close-on-exec flag for the descriptor so our jobs don't inherit it */
  flags = fcntl(fd, F_GETFD);
  flags |= FD_CLOEXEC;
  if (fcntl(fd, F_SETFD, flags) == -1) {rc = -3; goto done;}

  gethostname(ps->cfg->report_id, sizeof(ps->cfg->report_id));

  /* use a specific NIC if one was specified, supported here for multicast */
  if (iface) {
    int l = strlen(iface);
    if (l+1 >IFNAMSIZ) {utstring_printf(ps->em,"interface too long\n"); goto done;}

    struct ifreq ifr;
    ifr.ifr_addr.sa_family = AF_INET;
    memcpy(ifr.ifr_name, iface, l+1);

    /* does this interface support multicast? */
    if (ioctl(fd, SIOCGIFFLAGS, &ifr)) {utstring_printf(ps->em,"ioctl: %s\n", strerror(errno)); goto done;} 
    if (!(ifr.ifr_flags & IFF_MULTICAST)) {utstring_printf(ps->em,"%s does not multicast\n",iface); goto done;}

    /* get the interface IP address */
    struct in_addr iface_addr;
    if (ioctl(fd, SIOCGIFADDR, &ifr)) {utstring_printf(ps->em,"ioctl: %s\n", strerror(errno)); goto done;} 
    iface_addr = (((struct sockaddr_in *)&ifr.ifr_addr)->sin_addr);
    // utstring_printf(ps->em,"iface %s has addr %s\n", iface, inet_ntoa(iface_addr));
    strcat(ps->cfg->report_id, " ");
    strcat(ps->cfg->report_id, inet_ntoa(iface_addr));

    /* ask kernel to use its IP address for outgoing multicast */
    if (setsockopt(fd, IPPROTO_IP, IP_MULTICAST_IF, &iface_addr, sizeof(iface_addr))) {
      utstring_printf(ps->em,"setsockopt: %s\n", strerror(errno));
      goto done;
    }
  }


  /* specify the local address and port  */
  struct sockaddr_in sin;
  sin.sin_family = AF_INET;
  sin.sin_addr.s_addr = dest_ip;
  sin.sin_port = htons(port);

  if (connect(fd, (struct sockaddr*)&sin, sizeof(sin)) == -1) {
    utstring_printf(ps->em, "can't connect to %s: %s", dest, strerror(errno));
    rc = -3;
    goto done;
  }

  /* success */
  utarray_push_back(ps->cfg->report, &fd);
  rc = 0;

 done:
  if (rc == -1) { /* ps->em already set */ }
  if (rc == -2) utstring_printf(ps->em,"can't open file descriptor");
  if (rc == -3) { /* ps->em already set */ }
  if (rc < 0) {
    utstring_printf(ps->em, " at line %d", ps->line);
    ps->rc = -1;
  }
}